

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh_ptr.h
# Opt level: O2

void __thiscall ShPtr<HG::SessionImpl>::decref(ShPtr<HG::SessionImpl> *this)

{
  size_t *psVar1;
  ShPtrRep *pSVar2;
  SessionImpl *this_00;
  
  pSVar2 = this->cblock;
  if (pSVar2 != (ShPtrRep *)0x0) {
    psVar1 = &pSVar2->refCount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      this_00 = (SessionImpl *)pSVar2->ptr;
      if (this_00 != (SessionImpl *)0x0) {
        HG::SessionImpl::~SessionImpl(this_00);
      }
      operator_delete(this_00,0x18);
      operator_delete(this->cblock,0x10);
      this->cblock = (ShPtrRep *)0x0;
      return;
    }
  }
  return;
}

Assistant:

void decref() {
        if(cblock) {
            --cblock->refCount;
            if(cblock->refCount == 0) {
                T* ptr = cblock->asType<T>();
                delete ptr;
                delete cblock;
                cblock = 0;
            }
        }
    }